

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status
fdb_doc_create(fdb_doc **doc,void *key,size_t keylen,void *meta,size_t metalen,void *body,
              size_t bodylen)

{
  fdb_doc *pfVar1;
  void *pvVar2;
  fdb_status fVar3;
  
  fVar3 = FDB_RESULT_INVALID_ARGS;
  if (bodylen >> 0x20 == 0 && ((metalen < 0x10000 && keylen < 0xff81) && doc != (fdb_doc **)0x0)) {
    pfVar1 = (fdb_doc *)calloc(1,0x50);
    *doc = pfVar1;
    fVar3 = FDB_RESULT_ALLOC_FAIL;
    if (pfVar1 != (fdb_doc *)0x0) {
      pfVar1->seqnum = 0xffffffffffffffff;
      if (keylen == 0 || key == (void *)0x0) {
        pfVar1->key = (void *)0x0;
        keylen = 0;
      }
      else {
        pvVar2 = malloc(keylen);
        pfVar1->key = pvVar2;
        if (pvVar2 == (void *)0x0) {
          return FDB_RESULT_ALLOC_FAIL;
        }
        memcpy(pvVar2,key,keylen);
      }
      pfVar1->keylen = keylen;
      if (metalen == 0 || meta == (void *)0x0) {
        (*doc)->meta = (void *)0x0;
        metalen = 0;
      }
      else {
        pvVar2 = malloc(metalen);
        (*doc)->meta = pvVar2;
        if ((*doc)->meta == (void *)0x0) {
          return FDB_RESULT_ALLOC_FAIL;
        }
        memcpy((*doc)->meta,meta,metalen);
      }
      (*doc)->metalen = metalen;
      if (bodylen == 0 || body == (void *)0x0) {
        (*doc)->body = (void *)0x0;
        bodylen = 0;
      }
      else {
        pvVar2 = malloc(bodylen);
        (*doc)->body = pvVar2;
        if ((*doc)->body == (void *)0x0) {
          return FDB_RESULT_ALLOC_FAIL;
        }
        memcpy((*doc)->body,body,bodylen);
      }
      (*doc)->bodylen = bodylen;
      fVar3 = FDB_RESULT_SUCCESS;
    }
  }
  return fVar3;
}

Assistant:

LIBFDB_API
fdb_status fdb_doc_create(fdb_doc **doc, const void *key, size_t keylen,
                          const void *meta, size_t metalen,
                          const void *body, size_t bodylen)
{
    if (doc == NULL || keylen > FDB_MAX_KEYLEN ||
        metalen > FDB_MAX_METALEN || bodylen > FDB_MAX_BODYLEN) {
        return FDB_RESULT_INVALID_ARGS;
    }

    *doc = (fdb_doc*)calloc(1, sizeof(fdb_doc));
    if (*doc == NULL) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    (*doc)->seqnum = SEQNUM_NOT_USED;

    if (key && keylen > 0) {
        (*doc)->key = (void *)malloc(keylen);
        if ((*doc)->key == NULL) { // LCOV_EXCL_START
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        memcpy((*doc)->key, key, keylen);
        (*doc)->keylen = keylen;
    } else {
        (*doc)->key = NULL;
        (*doc)->keylen = 0;
    }

    if (meta && metalen > 0) {
        (*doc)->meta = (void *)malloc(metalen);
        if ((*doc)->meta == NULL) { // LCOV_EXCL_START
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        memcpy((*doc)->meta, meta, metalen);
        (*doc)->metalen = metalen;
    } else {
        (*doc)->meta = NULL;
        (*doc)->metalen = 0;
    }

    if (body && bodylen > 0) {
        (*doc)->body = (void *)malloc(bodylen);
        if ((*doc)->body == NULL) { // LCOV_EXCL_START
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        memcpy((*doc)->body, body, bodylen);
        (*doc)->bodylen = bodylen;
    } else {
        (*doc)->body = NULL;
        (*doc)->bodylen = 0;
    }

    return FDB_RESULT_SUCCESS;
}